

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentStorageBuffer::prepare
          (RenderFragmentStorageBuffer *this,PrepareRenderPassContext *context)

{
  pointer pcVar1;
  Context *pCVar2;
  DeviceInterface *deviceInterface;
  VkDevice device;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var3;
  VkDescriptorPool obj;
  VkDescriptorPoolSize VVar4;
  DeviceInterface *pDVar5;
  Handle<(vk::HandleType)21> HVar6;
  VkDevice pVVar7;
  VkAllocationCallbacks *pVVar8;
  const_iterator cVar9;
  VkDescriptorBufferInfo bufferInfo;
  VkDescriptorSetAllocateInfo allocateInfo;
  VkDescriptorSetLayoutBinding binding;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  VkDescriptorPoolSize poolSizes;
  VkDescriptorSetLayout layout;
  VkPushConstantRange pushConstantRange;
  Move<vk::Handle<(vk::HandleType)21>_> local_148;
  undefined1 local_128 [24];
  undefined4 uStack_110;
  undefined4 uStack_10c;
  VkDescriptorSetLayout *local_108;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  VkAllocationCallbacks *pVStack_e0;
  VkDescriptorPoolSize *local_d8;
  undefined8 local_d0;
  Move<vk::Handle<(vk::HandleType)21>_> *local_c8;
  undefined8 local_c0;
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  *local_b8;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  *pvStack_b0;
  long local_a8;
  VkRenderPass local_98;
  VkDescriptorPoolSize local_90;
  VkShaderModule local_88;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_80;
  VkShaderModule local_68;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_60;
  VkDescriptorSetLayout local_48;
  VkPushConstantRange local_40;
  
  local_98.m_internal = (context->m_renderPass).m_internal;
  pCVar2 = context->m_context->m_context;
  deviceInterface = pCVar2->m_vkd;
  device = pCVar2->m_device;
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)pCVar2->m_binaryCollection;
  pcVar1 = local_128 + 0x10;
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"render-quad.vert","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var3,(key_type *)local_128);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_f8,deviceInterface,device,
             *(ProgramBinary **)(cVar9._M_node + 2),0);
  DStack_60.m_device = local_e8;
  DStack_60.m_allocator = pVStack_e0;
  local_68.m_internal = local_f8._0_8_;
  DStack_60.m_deviceIface = (DeviceInterface *)local_f8._8_8_;
  local_f8._0_8_ = 0;
  local_f8._8_8_ = (DeviceInterface *)0x0;
  local_e8 = (VkDevice)0x0;
  pVStack_e0 = (VkAllocationCallbacks *)0x0;
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_context->m_context->m_binaryCollection;
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"storage-buffer.frag","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var3,(key_type *)local_128);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_f8,deviceInterface,device,
             *(ProgramBinary **)(cVar9._M_node + 2),0);
  DStack_80.m_device = local_e8;
  DStack_80.m_allocator = pVStack_e0;
  local_88.m_internal = local_f8._0_8_;
  DStack_80.m_deviceIface = (DeviceInterface *)local_f8._8_8_;
  local_f8._0_8_ = 0;
  local_f8._8_8_ = (DeviceInterface *)0x0;
  local_e8 = (VkDevice)0x0;
  pVStack_e0 = (VkAllocationCallbacks *)0x0;
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_b8 = (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)0x0;
  pvStack_b0 = (vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                *)0x0;
  local_a8 = 0;
  this->m_bufferSize = context->m_context->m_currentBufferSize;
  this->m_targetWidth = (long)context->m_targetWidth;
  this->m_targetHeight = (long)context->m_targetHeight;
  local_e8 = (VkDevice)0x0;
  local_f8._0_8_ = 0x700000000;
  local_f8._8_8_ = (DeviceInterface *)0x1000000001;
  std::vector<vk::VkDescriptorSetLayoutBinding,std::allocator<vk::VkDescriptorSetLayoutBinding>>::
  _M_realloc_insert<vk::VkDescriptorSetLayoutBinding_const&>
            ((vector<vk::VkDescriptorSetLayoutBinding,std::allocator<vk::VkDescriptorSetLayoutBinding>>
              *)&local_b8,(iterator)0x0,(VkDescriptorSetLayoutBinding *)local_f8);
  local_40.size = 0xc;
  local_40.stageFlags = 0x10;
  local_40.offset = 0;
  local_e8 = (VkDevice)0x0;
  local_f8._0_8_ = 0;
  local_f8._8_8_ = (DeviceInterface *)0x0;
  local_128._16_8_ = 0;
  local_128._0_8_ = (pointer)0x0;
  local_128._8_8_ = (pointer)0x0;
  createPipelineWithResources
            (deviceInterface,device,local_98,(deUint32)&local_68,&local_88,
             (VkShaderModule *)(ulong)(uint)context->m_targetWidth,context->m_targetHeight,
             (deUint32)(VkDescriptorSetLayoutBinding *)local_f8,
             (vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
              *)local_128,local_b8,pvStack_b0,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,1,&local_40,
             &this->m_resources);
  local_d8 = &local_90;
  local_90.type = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  local_90.descriptorCount = 1;
  local_f8._0_4_ = 0x21;
  local_f8._8_8_ = (DeviceInterface *)0x0;
  local_e8 = (VkDevice)0x100000001;
  pVStack_e0 = (VkAllocationCallbacks *)CONCAT44(pVStack_e0._4_4_,1);
  ::vk::createDescriptorPool
            (&local_148,deviceInterface,device,(VkDescriptorPoolCreateInfo *)local_f8,
             (VkAllocationCallbacks *)0x0);
  pVVar8 = local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  pVVar7 = local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  pDVar5 = local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  HVar6.m_internal =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_128._16_8_ =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  _uStack_110 = local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  local_128._0_8_ =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_128._8_8_ =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj.m_internal == 0) {
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = pVVar7;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = pVVar8;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = HVar6.m_internal;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = pDVar5;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj);
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = (VkDevice)local_128._16_8_;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)_uStack_110;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = local_128._0_8_;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_128._8_8_;
    if (local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                (&local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter,
                 (VkDescriptorPool)
                 local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal);
    }
  }
  local_48.m_internal =
       (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data
       .object.m_internal;
  local_108 = &local_48;
  local_128._0_4_ = 0x22;
  local_128._8_8_ = (pointer)0x0;
  local_128._16_8_ =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  uStack_110 = 1;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&local_148,deviceInterface,device,
             (VkDescriptorSetAllocateInfo *)local_128);
  pVVar8 = local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  pVVar7 = local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  pDVar5 = local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  HVar6.m_internal =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_e8 = local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  pVStack_e0 = local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  local_f8._0_8_ = local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
  ;
  local_f8._8_8_ =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar4 = (VkDescriptorPoolSize)
          (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
          m_internal;
  if (VVar4 == (VkDescriptorPoolSize)0x0) {
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
         pVVar7;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
    m_internal = (deUint64)pVVar8;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
         = HVar6.m_internal;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
    m_deviceIface = pDVar5;
  }
  else {
    pDVar5 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface;
    local_90 = VVar4;
    (*pDVar5->_vptr_DeviceInterface[0x3d])
              (pDVar5,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      deleter.m_device,
               (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal,1);
    *(VkDescriptorPoolCreateFlags *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device
         = (VkDescriptorPoolCreateFlags)local_e8;
    *(deUint32 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_device + 4) = local_e8._4_4_;
    *(deUint32 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
      m_internal = (deUint32)pVStack_e0;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_pool.m_internal + 4) = pVStack_e0._4_4_;
    *(undefined4 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
      m_internal = local_f8._0_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
             m_internal + 4) = local_f8._4_4_;
    *(undefined4 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
      m_deviceIface = local_f8._8_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface + 4) = local_f8._12_4_;
    if (local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal != 0) {
      local_f8._0_8_ =
           local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
      (*(local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                 m_deviceIface,
                 local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device,
                 local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
                 ,1);
    }
  }
  local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       (context->m_context->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
       object.m_internal;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)this->m_bufferSize;
  local_f8._0_4_ = 0x23;
  local_f8._8_8_ = (DeviceInterface *)0x0;
  local_e8 = (VkDevice)
             (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
             m_internal;
  pVStack_e0 = (VkAllocationCallbacks *)0x0;
  local_d8 = (VkDescriptorPoolSize *)0x700000001;
  local_d0 = 0;
  local_c0 = 0;
  local_c8 = &local_148;
  (*deviceInterface->_vptr_DeviceInterface[0x3e])(deviceInterface,device,1,local_f8,0,0);
  if (local_b8 !=
      (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
       *)0x0) {
    operator_delete(local_b8,local_a8 - (long)local_b8);
  }
  if (local_88.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_80,local_88);
  }
  if (local_68.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_60,local_68);
  }
  return;
}

Assistant:

void RenderFragmentStorageBuffer::prepare (PrepareRenderPassContext& context)
{
	const vk::DeviceInterface&					vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice							device					= context.getContext().getDevice();
	const vk::VkRenderPass						renderPass				= context.getRenderPass();
	const deUint32								subpass					= 0;
	const vk::Unique<vk::VkShaderModule>		vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-quad.vert"), 0));
	const vk::Unique<vk::VkShaderModule>		fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("storage-buffer.frag"), 0));
	vector<vk::VkDescriptorSetLayoutBinding>	bindings;

	m_bufferSize	= context.getBufferSize();
	m_targetWidth	= context.getTargetWidth();
	m_targetHeight	= context.getTargetHeight();

	{
		const vk::VkDescriptorSetLayoutBinding binding =
		{
			0u,
			vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
			1,
			vk::VK_SHADER_STAGE_FRAGMENT_BIT,
			DE_NULL
		};

		bindings.push_back(binding);
	}
	const vk::VkPushConstantRange pushConstantRange =
	{
		vk::VK_SHADER_STAGE_FRAGMENT_BIT,
		0u,
		12u
	};

	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vector<vk::VkVertexInputBindingDescription>(), vector<vk::VkVertexInputAttributeDescription>(), bindings, vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, 1u, &pushConstantRange, m_resources);

	{
		const deUint32							descriptorCount	= 1;
		const vk::VkDescriptorPoolSize			poolSizes		=
		{
			vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
			descriptorCount
		};
		const vk::VkDescriptorPoolCreateInfo	createInfo		=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,

			descriptorCount,
			1u,
			&poolSizes,
		};

		m_descriptorPool = vk::createDescriptorPool(vkd, device, &createInfo);
	}

	{
		const vk::VkDescriptorSetLayout			layout			= *m_resources.descriptorSetLayout;
		const vk::VkDescriptorSetAllocateInfo	allocateInfo	=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,

			*m_descriptorPool,
			1,
			&layout
		};

		m_descriptorSet = vk::allocateDescriptorSet(vkd, device, &allocateInfo);

		{
			const vk::VkDescriptorBufferInfo	bufferInfo	=
			{
				context.getBuffer(),
				0u,
				m_bufferSize
			};
			const vk::VkWriteDescriptorSet		write		=
			{
				vk::VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
				DE_NULL,
				m_descriptorSet.get(),
				0u,
				0u,
				1u,
				vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
				DE_NULL,
				&bufferInfo,
				DE_NULL,
			};

			vkd.updateDescriptorSets(device, 1u, &write, 0u, DE_NULL);
		}
	}
}